

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_section.c
# Opt level: O1

int pt_section_map_share(pt_section *section)

{
  mtx_t *pmVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = -1;
  if (section != (pt_section *)0x0) {
    pmVar1 = &section->lock;
    iVar4 = mtx_lock(pmVar1);
    iVar3 = -0x12;
    if (iVar4 == 0) {
      if (section->mcount == 0) {
        mtx_unlock(pmVar1);
        iVar3 = -1;
      }
      else {
        uVar2 = section->mcount + 1;
        if (uVar2 == 0) {
          mtx_unlock(pmVar1);
          iVar3 = -0x19;
        }
        else {
          section->mcount = uVar2;
          iVar4 = mtx_unlock(pmVar1);
          iVar3 = -0x12;
          if (iVar4 == 0) {
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int pt_section_map_share(struct pt_section *section)
{
	uint16_t mcount;
	int errcode;

	if (!section)
		return -pte_internal;

	errcode = pt_section_lock(section);
	if (errcode < 0)
		return errcode;

	mcount = section->mcount;
	if (!mcount) {
		(void) pt_section_unlock(section);
		return -pte_internal;
	}

	mcount += 1;
	if (!mcount) {
		(void) pt_section_unlock(section);
		return -pte_overflow;
	}

	section->mcount = mcount;

	return pt_section_unlock(section);
}